

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_CommitTwoSeparateTransactions_Test::TestBody
          (Transaction_CommitTwoSeparateTransactions_Test *this)

{
  char *message;
  mock_mutex mutex;
  transaction<std::unique_lock<mock_mutex>_> t1;
  database db;
  mutex_type local_181;
  unique_lock<mock_mutex> local_180;
  transaction<std::unique_lock<mock_mutex>_> local_170;
  undefined1 local_138 [8];
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_130;
  vacuum_mode local_b0;
  
  pstore::database::database<pstore::file::in_memory>
            ((database *)local_138,&(this->super_Transaction).store_.file_,true);
  local_b0 = disabled;
  local_180._M_owns = false;
  local_180._M_device = &local_181;
  std::unique_lock<mock_mutex>::lock(&local_180);
  local_180._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_170,(database *)local_138,&local_180);
  anon_unknown.dwarf_40a165::append_int(&local_170,1);
  pstore::transaction_base::commit(&local_170.super_transaction_base);
  local_170.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340
  ;
  pstore::transaction_base::rollback(&local_170.super_transaction_base);
  local_180._M_owns = false;
  local_180._M_device = &local_181;
  std::unique_lock<mock_mutex>::lock(&local_180);
  local_180._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_170,(database *)local_138,&local_180);
  anon_unknown.dwarf_40a165::append_int(&local_170,2);
  pstore::transaction_base::commit(&local_170.super_transaction_base);
  local_170.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340
  ;
  pstore::transaction_base::rollback(&local_170.super_transaction_base);
  pstore::database::~database((database *)local_138);
  local_170.super_transaction_base._vptr_transaction_base = (_func_int **)0x130;
  local_180._M_device =
       *(mutex_type **)
        ((this->super_Transaction).store_.buffer_.
         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x28);
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)local_138,"pstore::typed_address<pstore::trailer>::make (footer2)",
             "header->footer_pos.load ()",(typed_address<pstore::trailer> *)&local_170,
             (typed_address<pstore::trailer> *)&local_180);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (local_130._M_head_impl == (array<pstore::sat_entry,_65536UL> *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_130._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x1a4,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_180,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
    if (local_170.super_transaction_base._vptr_transaction_base != (_func_int **)0x0) {
      (**(code **)(*local_170.super_transaction_base._vptr_transaction_base + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       )local_130._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_130._M_head_impl);
  }
  return;
}

Assistant:

TEST_F (Transaction, CommitTwoSeparateTransactions) {
    // Append two individual transactions, each containing a single int.
    {
        pstore::database db{store_.file ()};
        db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        mock_mutex mutex;
        {
            auto t1 = begin (db, mock_lock (mutex));
            append_int (t1, 1);
            t1.commit ();
        }
        {
            auto t2 = begin (db, mock_lock (mutex));
            append_int (t2, 2);
            t2.commit ();
        }
    }

    std::size_t footer2 = pstore::leader_size;
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));

    pstore::header const * const header = this->get_header ();
    EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (footer2), header->footer_pos.load ());
}